

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O2

int ImGui::FindWindowFocusIndex(ImGuiWindow *window)

{
  uint uVar1;
  uint uVar2;
  
  uVar1 = (GImGui->WindowsFocusOrder).Size;
  uVar2 = uVar1;
  do {
    uVar2 = uVar2 - 1;
    if ((int)uVar1 < 1) {
      return -1;
    }
    uVar1 = uVar1 - 1;
  } while ((GImGui->WindowsFocusOrder).Data[uVar2] != window);
  return uVar1;
}

Assistant:

static int ImGui::FindWindowFocusIndex(ImGuiWindow* window) // FIXME-OPT O(N)
{
    ImGuiContext& g = *GImGui;
    for (int i = g.WindowsFocusOrder.Size-1; i >= 0; i--)
        if (g.WindowsFocusOrder[i] == window)
            return i;
    return -1;
}